

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::LogicalType>
          (Deserializer *this,field_id_t field_id,char *tag,LogicalType *ret)

{
  undefined6 in_register_00000032;
  type local_30;
  
  (*this->_vptr_Deserializer[2])(this,CONCAT62(in_register_00000032,field_id));
  Read<duckdb::LogicalType>(&local_30,this);
  LogicalType::operator=(ret,&local_30);
  LogicalType::~LogicalType(&local_30);
  (*this->_vptr_Deserializer[3])(this);
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}